

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_dey_clears_z_flag_Test::CpuTest_dey_clears_z_flag_Test
          (CpuTest_dey_clears_z_flag_Test *this)

{
  CpuTest_dey_clears_z_flag_Test *this_local;
  
  n_e_s::core::test::CpuTest::CpuTest(&this->super_CpuTest);
  (this->super_CpuTest).super_Test._vptr_Test =
       (_func_int **)&PTR__CpuTest_dey_clears_z_flag_Test_003e95a0;
  return;
}

Assistant:

TEST_F(CpuTest, dey_clears_z_flag) {
    stage_instruction(DEY);
    registers.y = 0;
    registers.p |= Z_FLAG;
    expected.y = 255;
    expected.p |= N_FLAG;

    step_execution(2);
    EXPECT_EQ(expected, registers);
}